

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::assign<float>
          (CImg<unsigned_char> *this,float *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  float fVar1;
  long lVar2;
  uchar *puVar3;
  uchar *puVar4;
  
  if ((values == (float *)0x0) ||
     ((ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x == 0)) {
    if ((this->_is_shared == false) && (this->_data != (uchar *)0x0)) {
      operator_delete__(this->_data);
    }
    this->_data = (uchar *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
    this->_is_shared = false;
  }
  else {
    assign(this,size_x,size_y,size_z,size_c);
    lVar2 = (ulong)this->_spectrum * (ulong)this->_depth *
            (ulong)this->_height * (ulong)this->_width;
    if (0 < lVar2) {
      puVar4 = this->_data;
      puVar3 = puVar4 + lVar2;
      do {
        fVar1 = *values;
        values = values + 1;
        *puVar4 = (uchar)(int)fVar1;
        puVar4 = puVar4 + 1;
      } while (puVar4 < puVar3);
    }
  }
  return this;
}

Assistant:

CImg<T>& assign(const t *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const unsigned long siz = (unsigned long)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      assign(size_x,size_y,size_z,size_c);
      const t *ptrs = values; cimg_for(*this,ptrd,T) *ptrd = (T)*(ptrs++);
      return *this;
    }